

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O1

void __thiscall
ON_PolynomialSurface::ON_PolynomialSurface(ON_PolynomialSurface *this,ON_PolynomialSurface *src)

{
  long lVar1;
  
  ON_4dPointArray::ON_4dPointArray(&this->m_cv);
  lVar1 = 0;
  do {
    ON_Interval::ON_Interval((ON_Interval *)((long)this->m_order + lVar1 + 0x20));
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x20);
  this->m_order[0] = 0;
  this->m_order[1] = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0x3ff0000000000000;
  *(undefined8 *)&this->field_0x38 = 0;
  *(undefined8 *)&this->field_0x40 = 0x3ff0000000000000;
  operator=(this,src);
  return;
}

Assistant:

ON_PolynomialSurface::ON_PolynomialSurface(const ON_PolynomialSurface& src)
{
  m_order[0] = 0;
  m_order[1] = 0;
  m_domain[0].m_t[0] = 0.0;
  m_domain[0].m_t[1] = 1.0;
  m_domain[1].m_t[0] = 0.0;
  m_domain[1].m_t[1] = 1.0;
  *this = src;
}